

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v10::detail::write_float<char,fmt::v10::appender,float>
                   (appender out,float value,format_specs<char> specs,locale_ref loc)

{
  int iVar1;
  float_specs fVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar3;
  int iVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  appender out_00;
  format_specs<char> *in_R8;
  float_specs *in_R9;
  appender it;
  string_view bytes;
  format_specs<char> specs_00;
  float_specs fspecs;
  format_specs<char> specs_local;
  big_decimal_fp f;
  memory_buffer buffer;
  
  specs_local._8_8_ = specs._8_8_;
  specs_local._0_8_ = specs._0_8_;
  fVar2 = parse_float_type_spec<char>(&specs_local);
  iVar4 = ((ushort)specs_local._9_2_ & 0x70) * 0x10;
  uVar6 = fVar2._4_4_ & 0xffff00ff;
  uVar7 = uVar6 + iVar4;
  fspecs.precision = fVar2.precision;
  fspecs._4_4_ = uVar7;
  if ((int)value < 0) {
    uVar7 = uVar6 | 0x100;
    fspecs = (float_specs)((ulong)fVar2 & 0xffff00ffffffffff | 0x10000000000);
    value = -value;
  }
  else if ((short)iVar4 == 0x100) {
    fspecs = (float_specs)((ulong)fVar2 & 0xffff00ffffffffff);
    uVar7 = uVar6;
  }
  if (value == INFINITY) {
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._1_7_ = 0;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_1_ = NAN(value);
    specs_00._8_8_ = &fspecs;
    specs_00._0_8_ = specs_local._8_8_;
    bVar3.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,out_00
                    ,specs_local.width._0_1_,specs_00,in_R9);
  }
  else {
    uVar6 = uVar7;
    if (((specs_local._9_2_ & 0xf) == 4) && ((uVar7 & 0xff00) != 0)) {
      buffer.super_buffer<char>._vptr_buffer =
           (_func_int **)
           CONCAT71(buffer.super_buffer<char>._vptr_buffer._1_7_,""[uVar7 >> 8 & 0xff]);
      buffer<char>::push_back
                ((buffer<char> *)
                 out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                 (char *)&buffer);
      uVar6 = uVar7 & 0xffff00ff;
      fspecs = (float_specs)(CONCAT44(uVar7,fspecs.precision) & 0xffff00ffffffffff);
      if (specs_local.width != 0) {
        specs_local.width = specs_local.width + -1;
      }
    }
    buffer.super_buffer<char>.ptr_ = buffer.store_;
    buffer.super_buffer<char>.size_ = 0;
    buffer.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_003489f8;
    buffer.super_buffer<char>.capacity_ = 500;
    cVar5 = (char)uVar6;
    if (cVar5 == '\x03') {
      if ((uVar6 & 0xff00) != 0) {
        f.significand = (char *)CONCAT71(f.significand._1_7_,""[uVar6 >> 8 & 0xff]);
        buffer<char>::push_back(&buffer.super_buffer<char>,(char *)&f);
      }
      format_hexfloat<double,_0>
                ((double)value,specs_local.precision,fspecs,&buffer.super_buffer<char>);
      bytes.size_ = (size_t)&specs_local;
      bytes.data_ = (char *)buffer.super_buffer<char>.size_;
      bVar3.container =
           (buffer<char> *)
           write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>
                     (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,
                      (appender)buffer.super_buffer<char>.ptr_,bytes,in_R8);
    }
    else {
      iVar4 = 6;
      if (specs_local.type == none) {
        iVar4 = specs_local.precision;
      }
      if (-1 < (long)specs_local._0_8_) {
        iVar4 = specs_local.precision;
      }
      if (cVar5 == '\x01') {
        if (iVar4 == 0x7fffffff) {
          throw_format_error("number is too big");
        }
        iVar4 = iVar4 + 1;
      }
      else {
        iVar1 = 1;
        if (iVar4 != 0) {
          iVar1 = iVar4;
        }
        if (cVar5 != '\x02') {
          iVar4 = iVar1;
        }
      }
      fspecs = (float_specs)(CONCAT44(uVar6,fspecs.precision) | 0x4000000000000);
      f.exponent = format_float<double>((double)value,iVar4,fspecs,&buffer.super_buffer<char>);
      fspecs.precision = iVar4;
      f.significand = buffer.super_buffer<char>.ptr_;
      f.significand_size = (int)buffer.super_buffer<char>.size_;
      bVar3.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                     (out,&f,&specs_local,fspecs,loc);
    }
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&buffer);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}